

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O3

void __thiscall Diligent::DeviceObjectArchive::Clear(DeviceObjectArchive *this)

{
  undefined8 *puVar1;
  IDataBlob *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> local_d8;
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> avStack_c0 [7];
  
  std::
  _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)this);
  lVar5 = 0;
  do {
    *(undefined8 *)
     ((long)&avStack_c0[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar5) = 0;
    *(undefined8 *)
     ((long)&avStack_c0[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_finish + lVar5) = 0;
    *(undefined8 *)
     ((long)&avStack_c0[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar5) = 0;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0xa8);
  lVar5 = 0;
  do {
    local_d8.super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         *(pointer *)
          ((long)&(this->m_DeviceShaders)._M_elems[0].
                  super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar5);
    uVar3 = *(undefined8 *)
             ((long)&avStack_c0[0].
                     super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar5);
    uVar4 = *(undefined8 *)
             ((long)&avStack_c0[0].
                     super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                     ._M_impl.super__Vector_impl_data._M_finish + lVar5);
    *(undefined8 *)
     ((long)&(this->m_DeviceShaders)._M_elems[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar5) =
         *(undefined8 *)
          ((long)&avStack_c0[0].
                  super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar5);
    puVar1 = (undefined8 *)
             ((long)&(this->m_DeviceShaders)._M_elems[0].
                     super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar5);
    local_d8.super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
    local_d8.super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
    puVar1 = (undefined8 *)
             ((long)&(this->m_DeviceShaders)._M_elems[0].
                     super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar5);
    *puVar1 = uVar3;
    puVar1[1] = uVar4;
    *(undefined8 *)
     ((long)&avStack_c0[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar5) = 0;
    *(undefined8 *)
     ((long)&avStack_c0[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_finish + lVar5) = 0;
    *(undefined8 *)
     ((long)&avStack_c0[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar5) = 0;
    std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::~vector
              (&local_d8);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0xa8);
  lVar5 = 0x90;
  do {
    std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::~vector
              ((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
               ((long)&avStack_c0[0].
                       super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  pIVar2 = (this->m_pArchiveData).m_pObject;
  if (pIVar2 != (IDataBlob *)0x0) {
    (*(pIVar2->super_IObject)._vptr_IObject[2])();
    (this->m_pArchiveData).m_pObject = (IDataBlob *)0x0;
  }
  this->m_ContentVersion = 0;
  return;
}

Assistant:

void DeviceObjectArchive::Clear() noexcept
{
    m_NamedResources.clear();
    m_DeviceShaders = {};
    m_pArchiveData.Release();
    m_ContentVersion = 0;
}